

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateDependentInlineMethods
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  FieldGenerator *pFVar2;
  long lVar3;
  long lVar4;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x6b) != '\0') {
    return;
  }
  pDVar1 = this->descriptor_;
  if (0 < *(int *)(pDVar1 + 0x2c)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      if (*(char *)(*(long *)(*(long *)(pDVar1 + 0x30) + 0x80 + lVar3) + 0x6f) == '\x01') {
        pFVar2 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)(*(long *)(pDVar1 + 0x30) + lVar3));
        (*pFVar2->_vptr_FieldGenerator[6])(pFVar2,printer);
      }
      lVar4 = lVar4 + 1;
      pDVar1 = this->descriptor_;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(pDVar1 + 0x2c));
  }
  GenerateDependentFieldAccessorDefinitions(this,printer);
  return;
}

Assistant:

void MessageGenerator::
GenerateDependentInlineMethods(io::Printer* printer) {
  if (IsMapEntryMessage(descriptor_)) return;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (descriptor_->field(i)->options().weak()) {
      field_generators_.get(descriptor_->field(i))
          .GenerateDependentInlineAccessorDefinitions(printer);
    }
  }
  GenerateDependentFieldAccessorDefinitions(printer);
}